

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

SPIRVariable * __thiscall
spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::
allocate<unsigned_int&,spv::StorageClass&,unsigned_int&>
          (ObjectPool<spirv_cross::SPIRVariable> *this,uint *p,StorageClass *p_1,uint *p_2)

{
  StorageClass SVar1;
  uint32_t uVar2;
  size_t sVar3;
  _Tuple_impl<0UL,_spirv_cross::SPIRVariable_*,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>
  _Var4;
  uint uVar5;
  ulong uVar6;
  _Head_base<0UL,_spirv_cross::SPIRVariable_*,_false> _Var7;
  SPIRVariable *pSVar8;
  
  if ((this->vacants).super_VectorView<spirv_cross::SPIRVariable_*>.buffer_size == 0) {
    uVar5 = this->start_object_count <<
            ((byte)(this->memory).
                   super_VectorView<std::unique_ptr<spirv_cross::SPIRVariable,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>_>
                   .buffer_size & 0x1f);
    _Var4.super__Head_base<0UL,_spirv_cross::SPIRVariable_*,_false>._M_head_impl =
         (_Head_base<0UL,_spirv_cross::SPIRVariable_*,_false>)malloc((ulong)uVar5 * 0xb0);
    if (_Var4.super__Head_base<0UL,_spirv_cross::SPIRVariable_*,_false>._M_head_impl !=
        (SPIRVariable *)0x0) {
      if (uVar5 != 0) {
        uVar6 = (ulong)uVar5;
        _Var7._M_head_impl =
             (SPIRVariable *)
             _Var4.super__Head_base<0UL,_spirv_cross::SPIRVariable_*,_false>._M_head_impl;
        do {
          SmallVector<spirv_cross::SPIRVariable_*,_0UL>::reserve
                    (&this->vacants,
                     (this->vacants).super_VectorView<spirv_cross::SPIRVariable_*>.buffer_size + 1);
          sVar3 = (this->vacants).super_VectorView<spirv_cross::SPIRVariable_*>.buffer_size;
          (this->vacants).super_VectorView<spirv_cross::SPIRVariable_*>.ptr[sVar3] =
               _Var7._M_head_impl;
          (this->vacants).super_VectorView<spirv_cross::SPIRVariable_*>.buffer_size = sVar3 + 1;
          _Var7._M_head_impl = _Var7._M_head_impl + 1;
          uVar6 = uVar6 - 1;
        } while (uVar6 != 0);
      }
      SmallVector<std::unique_ptr<spirv_cross::SPIRVariable,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>,_8UL>
      ::reserve(&this->memory,
                (this->memory).
                super_VectorView<std::unique_ptr<spirv_cross::SPIRVariable,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>_>
                .buffer_size + 1);
      sVar3 = (this->memory).
              super_VectorView<std::unique_ptr<spirv_cross::SPIRVariable,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>_>
              .buffer_size;
      (this->memory).
      super_VectorView<std::unique_ptr<spirv_cross::SPIRVariable,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>_>
      .ptr[sVar3]._M_t.
      super___uniq_ptr_impl<spirv_cross::SPIRVariable,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>
      ._M_t.
      super__Tuple_impl<0UL,_spirv_cross::SPIRVariable_*,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>
      .super__Head_base<0UL,_spirv_cross::SPIRVariable_*,_false> =
           _Var4.super__Head_base<0UL,_spirv_cross::SPIRVariable_*,_false>._M_head_impl;
      (this->memory).
      super_VectorView<std::unique_ptr<spirv_cross::SPIRVariable,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>_>
      .buffer_size = sVar3 + 1;
      if (_Var4.super__Head_base<0UL,_spirv_cross::SPIRVariable_*,_false>._M_head_impl !=
          (SPIRVariable *)0x0) goto LAB_0034a769;
    }
    pSVar8 = (SPIRVariable *)0x0;
  }
  else {
LAB_0034a769:
    sVar3 = (this->vacants).super_VectorView<spirv_cross::SPIRVariable_*>.buffer_size;
    pSVar8 = (this->vacants).super_VectorView<spirv_cross::SPIRVariable_*>.ptr[sVar3 - 1];
    if (sVar3 != 0) {
      SmallVector<spirv_cross::SPIRVariable_*,_0UL>::resize(&this->vacants,sVar3 - 1);
    }
    uVar5 = *p;
    SVar1 = *p_1;
    uVar2 = *p_2;
    (pSVar8->super_IVariant).self.id = 0;
    (pSVar8->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__SPIRVariable_003fd5b0;
    *(uint *)&(pSVar8->super_IVariant).field_0xc = uVar5;
    pSVar8->storage = SVar1;
    pSVar8->decoration = 0;
    (pSVar8->initializer).id = uVar2;
    *(undefined8 *)&pSVar8->basevariable = 0;
    *(undefined8 *)((long)&(pSVar8->dereference_chain).super_VectorView<unsigned_int>.ptr + 4) = 0;
    (pSVar8->dereference_chain).super_VectorView<unsigned_int>.buffer_size = 0;
    (pSVar8->dereference_chain).buffer_capacity = 0;
    (pSVar8->dereference_chain).super_VectorView<unsigned_int>.ptr =
         (uint *)&(pSVar8->dereference_chain).stack_storage;
    (pSVar8->dereference_chain).buffer_capacity = 8;
    pSVar8->compat_builtin = false;
    pSVar8->statically_assigned = false;
    *(undefined8 *)&pSVar8->static_expression = 0;
    *(undefined8 *)
     ((long)&(pSVar8->dependees).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr
     + 4) = 0;
    (pSVar8->dependees).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size =
         0;
    (pSVar8->dependees).buffer_capacity = 0;
    (pSVar8->dependees).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr =
         (TypedID<(spirv_cross::Types)0> *)&(pSVar8->dependees).stack_storage;
    (pSVar8->dependees).buffer_capacity = 8;
    pSVar8->parameter = (Parameter *)0x0;
    *(undefined8 *)((long)&pSVar8->remapped_components + 2) = 0;
    pSVar8->deferred_declaration = false;
    pSVar8->phi_variable = false;
    pSVar8->allocate_temporary_copy = false;
    pSVar8->remapped_variable = false;
    pSVar8->remapped_components = 0;
  }
  return pSVar8;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}